

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

Transaction * __thiscall
cfd::core::Block::GetTransaction(Transaction *__return_storage_ptr__,Block *this,Txid *txid)

{
  pointer pTVar1;
  bool bVar2;
  CfdException *this_00;
  size_t index;
  ulong uVar3;
  long lVar4;
  long lVar5;
  allocator local_51;
  string local_50;
  
  lVar5 = 0;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pTVar1 = (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->txids_).
                      super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <= uVar3) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&local_50,"target txid not found.",&local_51);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar2 = Txid::Equals(txid,(Txid *)((long)&pTVar1->_vptr_Txid + lVar5));
    if (bVar2) break;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x18;
    lVar5 = lVar5 + 0x20;
  }
  Transaction::Transaction
            (__return_storage_ptr__,
             (ByteData *)
             ((long)&(((this->txs_).
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data._M_start)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
             lVar4));
  return __return_storage_ptr__;
}

Assistant:

Transaction Block::GetTransaction(const Txid& txid) const {
  for (size_t index = 0; index < txids_.size(); ++index) {
    if (txid.Equals(txids_[index])) {
      return Transaction(txs_[index]);
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "target txid not found.");
}